

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::TextFormat::PrintFieldValueToString
               (Message *message,FieldDescriptor *field,int index,string *output)

{
  Printer local_98;
  string *local_28;
  string *output_local;
  FieldDescriptor *pFStack_18;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  
  local_28 = output;
  output_local._4_4_ = index;
  pFStack_18 = field;
  field_local = (FieldDescriptor *)message;
  Printer::Printer(&local_98);
  Printer::PrintFieldValueToString
            (&local_98,(Message *)field_local,pFStack_18,output_local._4_4_,local_28);
  Printer::~Printer(&local_98);
  return;
}

Assistant:

void TextFormat::PrintFieldValueToString(
    const Message& message, const FieldDescriptor* field, int index,
    std::string* output) {
  return Printer().PrintFieldValueToString(message, field, index, output);
}